

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O3

QString * __thiscall
QAccessibleTableCell::text(QString *__return_storage_ptr__,QAccessibleTableCell *this,Text t)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char cVar4;
  char16_t *tmp;
  QAbstractItemModel *pQVar5;
  long in_FS_OFFSET;
  QModelIndex local_90;
  QArrayData *local_78;
  char16_t *pcStack_70;
  qsizetype local_68;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  cVar4 = (**(code **)(*(long *)this + 0x10))(this);
  if (cVar4 == '\0') goto LAB_0052bce5;
  pQVar5 = QAbstractItemView::model((QAbstractItemView *)(this->view).wp.value);
  if (t == Description) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_90,&this->m_index);
    (**(code **)(*(long *)pQVar5 + 0x90))(&local_58,pQVar5,&local_90,0xc);
    ::QVariant::toString();
    pQVar1 = local_78;
    local_78 = (QArrayData *)0x0;
    (__return_storage_ptr__->d).d = (Data *)pQVar1;
    (__return_storage_ptr__->d).ptr = pcStack_70;
    pcStack_70 = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_68;
    local_68 = 0;
  }
  else {
    if (t != Name) goto LAB_0052bce5;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_90,&this->m_index);
    (**(code **)(*(long *)pQVar5 + 0x90))(&local_58,pQVar5,&local_90,0xb);
    ::QVariant::toString();
    qVar3 = local_68;
    pcVar2 = pcStack_70;
    pQVar1 = local_78;
    (__return_storage_ptr__->d).d = (Data *)local_78;
    local_78 = (QArrayData *)0x0;
    (__return_storage_ptr__->d).ptr = pcStack_70;
    pcStack_70 = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_68;
    local_68 = 0;
    ::QVariant::~QVariant(&local_58);
    if (qVar3 != 0) goto LAB_0052bce5;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_90,&this->m_index);
    (**(code **)(*(long *)pQVar5 + 0x90))(&local_58,pQVar5,&local_90,0);
    ::QVariant::toString();
    (__return_storage_ptr__->d).d = (Data *)local_78;
    (__return_storage_ptr__->d).ptr = pcStack_70;
    (__return_storage_ptr__->d).size = local_68;
    local_68 = 0;
    local_78 = pQVar1;
    pcStack_70 = pcVar2;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  ::QVariant::~QVariant(&local_58);
LAB_0052bce5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QAccessibleTableCell::text(QAccessible::Text t) const
{
    QString value;
    if (!isValid())
        return value;
    QAbstractItemModel *model = view->model();
    switch (t) {
    case QAccessible::Name:
        value = model->data(m_index, Qt::AccessibleTextRole).toString();
        if (value.isEmpty())
            value = model->data(m_index, Qt::DisplayRole).toString();
        break;
    case QAccessible::Description:
        value = model->data(m_index, Qt::AccessibleDescriptionRole).toString();
        break;
    default:
        break;
    }
    return value;
}